

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int expect(int id)

{
  char *pcVar1;
  bool bVar2;
  char buf [16];
  char acStack_28 [24];
  
  bVar2 = t->id != id;
  if (bVar2) {
    pcVar1 = token_name(id);
    strcpy(acStack_28,pcVar1);
    pcVar1 = token_name(last_id);
    err(E,"expected %s after %s",acStack_28,pcVar1);
  }
  else {
    last_id = id;
    t = get_token();
    eline = t->line;
    ecolumn = t->column;
  }
  return (uint)!bVar2;
}

Assistant:

int expect(int id)
{
    char buf[16];
    if (accept(id))
        return 1;
    strcpy(buf, token_name(id));
    err(E, "expected %s after %s", buf, token_name(last_id));
    return 0;
}